

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

void __thiscall QDir::QDir(QDir *this,QString *path)

{
  QDirPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDirPrivate *)operator_new(0x118);
  local_38.d = (Data *)0x0;
  local_38.ptr = (QString *)0x0;
  local_38.size = 0;
  QDirPrivate::QDirPrivate(this_00,path,(QStringList *)&local_38,(SortFlags)0x10,(Filters)0x7);
  (this->d_ptr).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDir::QDir(const QString &path) : d_ptr(new QDirPrivate(path))
{
}